

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# disassemble.cpp
# Opt level: O1

void __thiscall
spvtools::disassemble::InstructionDisassembler::GenerateCommentForDecoratedId
          (InstructionDisassembler *this,spv_parsed_instruction_t *inst)

{
  long lVar1;
  size_t sVar2;
  mapped_type *pmVar3;
  uint16_t uVar4;
  ushort uVar5;
  char *__s;
  uint32_t id;
  ostringstream partial;
  key_type local_1cc;
  long *local_1c8;
  long local_1c0;
  long local_1b8 [2];
  ostringstream local_1a8 [112];
  ios_base local_138 [264];
  
  if (this->comment_ != 0) {
    uVar4 = inst->opcode;
    std::__cxx11::ostringstream::ostringstream(local_1a8);
    local_1cc = 0;
    if ((uVar4 == 0x47) && (local_1cc = inst->words[inst->operands->offset], 1 < inst->num_operands)
       ) {
      __s = "";
      uVar4 = 1;
      do {
        sVar2 = strlen(__s);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,__s,sVar2);
        EmitOperand(this,(ostream *)local_1a8,inst,uVar4);
        uVar5 = uVar4 + 1;
        __s = " ";
        uVar4 = uVar4 + 1;
      } while (uVar5 < inst->num_operands);
    }
    if (local_1cc != 0) {
      pmVar3 = std::__detail::
               _Map_base<unsigned_int,_std::pair<const_unsigned_int,_std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_unsigned_int,_std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
               ::operator[]((_Map_base<unsigned_int,_std::pair<const_unsigned_int,_std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_unsigned_int,_std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                             *)&this->id_comments_,&local_1cc);
      std::__cxx11::stringbuf::str();
      lVar1 = local_1c0;
      if (local_1c8 != local_1b8) {
        operator_delete(local_1c8,local_1b8[0] + 1);
      }
      if (lVar1 != 0) {
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)pmVar3,", ",2);
      }
      std::__cxx11::stringbuf::str();
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)pmVar3,(char *)local_1c8,local_1c0);
      if (local_1c8 != local_1b8) {
        operator_delete(local_1c8,local_1b8[0] + 1);
      }
    }
    std::__cxx11::ostringstream::~ostringstream(local_1a8);
    std::ios_base::~ios_base(local_138);
    return;
  }
  __assert_fail("comment_",
                "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/disassemble.cpp"
                ,0x312,
                "void spvtools::disassemble::InstructionDisassembler::GenerateCommentForDecoratedId(const spv_parsed_instruction_t &)"
               );
}

Assistant:

void InstructionDisassembler::GenerateCommentForDecoratedId(
    const spv_parsed_instruction_t& inst) {
  assert(comment_);
  auto opcode = static_cast<spv::Op>(inst.opcode);

  std::ostringstream partial;
  uint32_t id = 0;
  const char* separator = "";

  switch (opcode) {
    case spv::Op::OpDecorate:
      // Take everything after `OpDecorate %id` and associate it with id.
      id = inst.words[inst.operands[0].offset];
      for (uint16_t i = 1; i < inst.num_operands; i++) {
        partial << separator;
        separator = " ";
        EmitOperand(partial, inst, i);
      }
      break;
    default:
      break;
  }

  if (id == 0) {
    return;
  }

  // Add the new comment to the comments of this id
  std::ostringstream& id_comment = id_comments_[id];
  if (!id_comment.str().empty()) {
    id_comment << ", ";
  }
  id_comment << partial.str();
}